

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

void __thiscall
SQCompilation::SQParser::ParseTableOrClass
          (SQParser *this,TableDecl *decl,SQInteger separator,SQInteger terminator)

{
  long lVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Expr *pEVar8;
  Expr *pEVar9;
  Id *name;
  Chunk *pCVar10;
  FunctionDecl *pFVar11;
  int iVar12;
  uint local_54;
  
  if (500 < this->_depth) {
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  lVar1 = this->_token;
  do {
    if (lVar1 == terminator) {
      Lex(this);
      this->_depth = this->_depth - 1;
      return;
    }
    SVar2 = (this->_lex)._tokencolumn;
    SVar3 = (this->_lex)._tokenline;
    bVar5 = lVar1 == 0x142 && separator != 0x2c;
    if (bVar5) {
      Lex(this);
    }
    local_54 = (uint)bVar5;
    lVar1 = this->_token;
    if (lVar1 < 0x11d) {
      if (lVar1 == 0x5b) {
        Lex(this);
        pEVar8 = Expression(this,SQE_RVALUE);
        Expect(this,0x5d);
        Expect(this,0x3d);
        pEVar9 = Expression(this,SQE_RVALUE);
        TableDecl::addMember(decl,pEVar8,pEVar9,local_54 | 2);
      }
      else {
        if ((lVar1 != 0x103) || (separator != 0x2c)) goto LAB_00165529;
        pEVar8 = Expect(this,0x103);
        Expect(this,0x3a);
        pEVar9 = Expression(this,SQE_RVALUE);
        TableDecl::addMember(decl,pEVar8,pEVar9,local_54 | 4);
      }
    }
    else if ((lVar1 == 0x136) || (lVar1 == 0x11d)) {
      SVar2 = (this->_lex)._tokencolumn;
      SVar3 = (this->_lex)._tokenline;
      Lex(this);
      if (lVar1 == 0x11d) {
        name = (Id *)Expect(this,0x102);
      }
      else {
        pCVar10 = Arena::findChunk(this->_astArena,0x28);
        name = (Id *)pCVar10->_ptr;
        pCVar10->_ptr = (uint8_t *)(name + 1);
        (name->super_Expr).super_Node._op = TO_ID;
        (name->super_Expr).super_Node._coordinates.lineStart = -1;
        (name->super_Expr).super_Node._coordinates.columnStart = -1;
        (name->super_Expr).super_Node._coordinates.lineEnd = -1;
        (name->super_Expr).super_Node._coordinates.columnEnd = -1;
        (name->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
             (_func_int **)&PTR__ArenaObj_001a4900;
        name->_id = "constructor";
      }
      pp_Var4 = (_func_int **)name->_id;
      pCVar10 = Arena::findChunk(this->_astArena,0x28);
      pEVar8 = (Expr *)pCVar10->_ptr;
      pCVar10->_ptr = (uint8_t *)&pEVar8[1].super_Node._coordinates;
      *(undefined8 *)&(pEVar8->super_Node)._op = 0x39;
      (pEVar8->super_Node)._coordinates.lineStart = -1;
      (pEVar8->super_Node)._coordinates.columnStart = -1;
      (pEVar8->super_Node)._coordinates.lineEnd = -1;
      (pEVar8->super_Node)._coordinates.columnEnd = -1;
      (pEVar8->super_Node).super_ArenaObj._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a4ad8;
      pEVar8[1].super_Node.super_ArenaObj._vptr_ArenaObj = pp_Var4;
      iVar12 = (int)SVar3;
      (pEVar8->super_Node)._coordinates.lineStart = iVar12;
      iVar7 = (int)SVar2;
      (pEVar8->super_Node)._coordinates.columnStart = iVar7;
      (pEVar8->super_Node)._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (pEVar8->super_Node)._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      Expect(this,0x28);
      pFVar11 = CreateFunction(this,name,false,lVar1 == 0x136);
      pCVar10 = Arena::findChunk(this->_astArena,0x28);
      pEVar9 = (Expr *)pCVar10->_ptr;
      pCVar10->_ptr = (uint8_t *)&pEVar9[1].super_Node._coordinates;
      (pEVar9->super_Node)._op = TO_DECL_EXPR;
      (pEVar9->super_Node)._coordinates.lineStart = -1;
      (pEVar9->super_Node)._coordinates.columnStart = -1;
      (pEVar9->super_Node)._coordinates.lineEnd = -1;
      (pEVar9->super_Node)._coordinates.columnEnd = -1;
      (pEVar9->super_Node).super_ArenaObj._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a4b10;
      pEVar9[1].super_Node.super_ArenaObj._vptr_ArenaObj = (_func_int **)pFVar11;
      (pEVar9->super_Node)._coordinates.lineStart = iVar12;
      (pEVar9->super_Node)._coordinates.columnStart = iVar7;
      (pEVar9->super_Node)._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (pEVar9->super_Node)._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      TableDecl::addMember(decl,pEVar8,pEVar9,local_54);
    }
    else {
LAB_00165529:
      pEVar9 = Expect(this,0x102);
      (pEVar9->super_Node)._coordinates.lineStart = (int)SVar3;
      (pEVar9->super_Node)._coordinates.columnStart = (int)SVar2;
      (pEVar9->super_Node)._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (pEVar9->super_Node)._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      pp_Var4 = pEVar9[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      pCVar10 = Arena::findChunk(this->_astArena,0x28);
      pEVar8 = (Expr *)pCVar10->_ptr;
      pCVar10->_ptr = (uint8_t *)&pEVar8[1].super_Node._coordinates;
      *(undefined8 *)&(pEVar8->super_Node)._op = 0x39;
      (pEVar8->super_Node)._coordinates.lineStart = -1;
      (pEVar8->super_Node)._coordinates.columnStart = -1;
      (pEVar8->super_Node)._coordinates.lineEnd = -1;
      (pEVar8->super_Node)._coordinates.columnEnd = -1;
      (pEVar8->super_Node).super_ArenaObj._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a4ad8;
      pEVar8[1].super_Node.super_ArenaObj._vptr_ArenaObj = pp_Var4;
      iVar7 = (pEVar9->super_Node)._coordinates.columnStart;
      iVar12 = (pEVar9->super_Node)._coordinates.lineEnd;
      iVar6 = (pEVar9->super_Node)._coordinates.columnEnd;
      (pEVar8->super_Node)._coordinates.lineStart = (pEVar9->super_Node)._coordinates.lineStart;
      (pEVar8->super_Node)._coordinates.columnStart = iVar7;
      (pEVar8->super_Node)._coordinates.lineEnd = iVar12;
      (pEVar8->super_Node)._coordinates.columnEnd = iVar6;
      if ((separator == 0x2c) &&
         ((((lVar1 = this->_token, lVar1 == 0x2c || (lVar1 == 0x102)) || (lVar1 == terminator)) ||
          ((lVar1 == 0x11d || (lVar1 == 0x5b)))))) {
        TableDecl::addMember(decl,pEVar8,pEVar9,local_54);
      }
      else {
        Expect(this,0x3d);
        pEVar9 = Expression(this,SQE_RVALUE);
        TableDecl::addMember(decl,pEVar8,pEVar9,local_54);
      }
    }
    if (this->_token == separator) {
      Lex(this);
    }
    lVar1 = this->_token;
  } while( true );
}

Assistant:

void SQParser::ParseTableOrClass(TableDecl *decl, SQInteger separator, SQInteger terminator)
{
    NestingChecker nc(this);
    NewObjectType otype = separator==_SC(',') ? NOT_TABLE : NOT_CLASS;

    while(_token != terminator) {
        SQInteger l = line();
        SQInteger c = column();
        unsigned flags = 0;
        //check if is an static
        if(otype == NOT_CLASS) {
            if(_token == TK_STATIC) {
                flags |= TMF_STATIC;
                Lex();
            }
        }

        switch (_token) {
        case TK_FUNCTION:
        case TK_CONSTRUCTOR: {
            SQInteger tk = _token;
            SQInteger l = line(), c = column();
            Lex();
            Id *funcName = tk == TK_FUNCTION ? (Id *)Expect(TK_IDENTIFIER) : newNode<Id>(_SC("constructor"));
            assert(funcName);
            LiteralExpr *key = newNode<LiteralExpr>(funcName->id()); //-V522
            setCoordinates(key, l, c);
            Expect(_SC('('));
            FunctionDecl *f = CreateFunction(funcName, false, tk == TK_CONSTRUCTOR);
            DeclExpr *e = newNode<DeclExpr>(f);
            setCoordinates(e, l, c);
            decl->addMember(key, e, flags);
        }
        break;
        case _SC('['): {
            Lex();

            Expr *key = Expression(SQE_RVALUE); //-V522
            assert(key);
            Expect(_SC(']'));
            Expect(_SC('='));
            Expr *value = Expression(SQE_RVALUE);
            decl->addMember(key, value, flags | TMF_DYNAMIC_KEY);
            break;
        }
        case TK_STRING_LITERAL: //JSON
            if (otype == NOT_TABLE) { //only works for tables
                LiteralExpr *key = (LiteralExpr *)Expect(TK_STRING_LITERAL);  //-V522
                assert(key);
                Expect(_SC(':'));
                Expr *expr = Expression(SQE_RVALUE);
                decl->addMember(key, expr, flags | TMF_JSON);
                break;
            }  //-V796
        default: {
            Id *id = (Id *)setCoordinates(Expect(TK_IDENTIFIER), l, c);
            assert(id);
            LiteralExpr *key = newNode<LiteralExpr>(id->id()); //-V522
            copyCoordinates(id, key);
            if ((otype == NOT_TABLE) &&
                (_token == TK_IDENTIFIER || _token == separator || _token == terminator || _token == _SC('[')
                    || _token == TK_FUNCTION)) {
                decl->addMember(key, id, flags);
            }
            else {
                Expect(_SC('='));
                Expr *expr = Expression(SQE_RVALUE);
                decl->addMember(key, expr, flags);
            }
        }
        }
        if (_token == separator) Lex(); //optional comma/semicolon
    }

    Lex();
}